

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamStandardIndex::Create(BamStandardIndex *this)

{
  BamReaderPrivate *pBVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  int64_t iVar5;
  ostream *poVar6;
  uint uVar7;
  BamReaderPrivate *pBVar8;
  string *this_00;
  undefined4 uVar9;
  undefined4 uVar10;
  allocator local_3fd;
  uint32_t currentBin;
  BamReaderPrivate *local_3f8;
  int local_3ec;
  uint64_t lastOffset;
  uint64_t currentOffset;
  uint64_t local_3d8;
  int local_3cc;
  string local_3c8;
  BaiReferenceEntry refEntry;
  string indexFilename;
  int local_334;
  string local_330;
  string readerError;
  string message;
  undefined4 local_e0;
  int local_dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [10];
  
  pBVar8 = (this->super_BamIndex).m_reader;
  if ((pBVar8 == (BamReaderPrivate *)0x0) || (bVar2 = BamReaderPrivate::IsOpen(pBVar8), !bVar2)) {
    std::__cxx11::string::string
              ((string *)&readerError,"BamStandardIndex::Create",(allocator *)&refEntry);
    std::__cxx11::string::string
              ((string *)&message,"could not create index: reader is not open",
               (allocator *)&indexFilename);
    BamIndex::SetErrorString(&this->super_BamIndex,&readerError,&message);
  }
  else {
    bVar2 = BamReaderPrivate::Rewind((this->super_BamIndex).m_reader);
    if (bVar2) {
      local_3f8 = (BamReaderPrivate *)this;
      BamReaderPrivate::Filename_abi_cxx11_(&readerError,(this->super_BamIndex).m_reader);
      Extension_abi_cxx11_();
      std::operator+(&indexFilename,&readerError,&message);
      std::__cxx11::string::~string((string *)&message);
      std::__cxx11::string::~string((string *)&readerError);
      OpenFile(this,&indexFilename,ReadWrite);
      iVar3 = BamReaderPrivate::GetReferenceCount((this->super_BamIndex).m_reader);
      local_334 = iVar3;
      ReserveForSummary(this,&local_334);
      WriteHeader(this);
      currentBin = 0xffffffff;
      uVar4 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
      lastOffset = uVar4;
      currentOffset = uVar4;
      local_3cc = iVar3;
      BamAlignment::BamAlignment((BamAlignment *)&message);
      refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header;
      refEntry.ID = -1;
      refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      refEntry.LinearOffsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      refEntry.LinearOffsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      refEntry.LinearOffsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3ec = -1;
      uVar7 = 0xffffffff;
      uVar9 = -1;
      uVar10 = -1;
      local_3d8 = uVar4;
      refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           refEntry.Bins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        pBVar8 = (BamReaderPrivate *)(local_3f8->m_filename)._M_dataplus._M_p;
        bVar2 = BamReaderPrivate::LoadNextAlignment(pBVar8,(BamAlignment *)&message);
        if (!bVar2) break;
        if (uVar10 == local_e0) {
          if (local_3ec <= local_dc) goto LAB_00147d12;
          std::__cxx11::string::string((string *)&local_3c8,"",(allocator *)&local_330);
          pBVar8 = local_3f8;
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)&readerError,(string *)&local_3c8,_S_out|_S_in);
          iVar3 = local_3ec;
          std::__cxx11::string::~string((string *)&local_3c8);
          poVar6 = std::operator<<((ostream *)readerError.field_2._M_local_buf,
                                   "BAM file is not properly sorted by coordinate");
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,"Current alignment position: ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_dc);
          poVar6 = std::operator<<(poVar6," < previous alignment position: ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
          poVar6 = std::operator<<(poVar6," on reference ID: ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_e0);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::string((string *)&local_3c8,"BamStandardIndex::Create",&local_3fd);
          std::__cxx11::stringbuf::str();
          BamIndex::SetErrorString((BamIndex *)pBVar8,&local_3c8,&local_330);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::stringstream::~stringstream((stringstream *)&readerError);
LAB_00148091:
          BaiReferenceEntry::~BaiReferenceEntry(&refEntry);
          BamAlignment::~BamAlignment((BamAlignment *)&message);
          this_00 = &indexFilename;
          goto LAB_001481f6;
        }
        if (uVar10 == -1) {
          for (iVar3 = 0; iVar3 < (int)local_e0; iVar3 = iVar3 + 1) {
            readerError.field_2._M_allocated_capacity._0_4_ = 0;
            readerError.field_2._8_8_ = 0;
            readerError._M_dataplus._M_p._0_4_ = iVar3;
            WriteReferenceEntry((BamStandardIndex *)local_3f8,(BaiReferenceEntry *)&readerError);
            pBVar8 = (BamReaderPrivate *)&readerError;
            BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)&readerError);
          }
        }
        else {
          SaveAlignmentChunkToBin
                    ((BamStandardIndex *)pBVar8,&refEntry.Bins,&currentBin,&currentOffset,
                     &lastOffset);
          pBVar8 = local_3f8;
          WriteReferenceEntry((BamStandardIndex *)local_3f8,&refEntry);
          ClearReferenceEntry((BamStandardIndex *)pBVar8,&refEntry);
          pBVar1 = local_3f8;
          while (uVar10 = uVar10 + 1, (int)uVar10 < (int)local_e0) {
            readerError.field_2._M_allocated_capacity._0_4_ = 0;
            readerError.field_2._8_8_ = 0;
            readerError._M_dataplus._M_p._0_4_ = uVar10;
            WriteReferenceEntry((BamStandardIndex *)pBVar1,(BaiReferenceEntry *)&readerError);
            pBVar8 = (BamReaderPrivate *)&readerError;
            BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)&readerError);
          }
          currentBin = (uint32_t)(ushort)local_d8[0]._0_2_;
          currentOffset = uVar4;
          local_3d8 = uVar4;
          uVar9 = local_e0;
        }
        uVar7 = 0xffffffff;
        refEntry.ID = local_e0;
        uVar10 = local_e0;
LAB_00147d12:
        if ((ushort)local_d8[0]._0_2_ < 0x1249 && -1 < (int)uVar10) {
          pBVar8 = (BamReaderPrivate *)&message;
          readerError._M_dataplus._M_p._0_4_ =
               BamAlignment::GetEndPosition((BamAlignment *)pBVar8,false,false);
          SaveLinearOffsetEntry
                    ((BamStandardIndex *)pBVar8,&refEntry.LinearOffsets,&local_dc,
                     (int *)&readerError,&lastOffset);
        }
        if (uVar7 != (ushort)local_d8[0]._0_2_) {
          if (currentBin != 0xffffffff) {
            SaveAlignmentChunkToBin
                      ((BamStandardIndex *)pBVar8,&refEntry.Bins,&currentBin,&currentOffset,
                       &lastOffset);
          }
          currentBin = (uint32_t)(ushort)local_d8[0]._0_2_;
          uVar9 = local_e0;
          currentOffset = uVar4;
          local_3d8 = uVar4;
          uVar7 = currentBin;
          if ((int)local_e0 < 0) break;
        }
        iVar5 = BamReaderPrivate::Tell((BamReaderPrivate *)(local_3f8->m_filename)._M_dataplus._M_p)
        ;
        if (iVar5 <= (long)uVar4) {
          std::__cxx11::string::string
                    ((string *)&readerError,"BamStandardIndex::Create",(allocator *)&local_330);
          pBVar8 = local_3f8;
          std::__cxx11::string::string((string *)&local_3c8,"calculating offsets failed",&local_3fd)
          ;
          BamIndex::SetErrorString((BamIndex *)pBVar8,&readerError,&local_3c8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&readerError);
          goto LAB_00148091;
        }
        uVar4 = BamReaderPrivate::Tell((BamReaderPrivate *)(local_3f8->m_filename)._M_dataplus._M_p)
        ;
        lastOffset = uVar4;
        local_3ec = local_dc;
      }
      iVar3 = local_3cc;
      pBVar1 = local_3f8;
      if (uVar4 != local_3d8) {
        SaveAlignmentChunkToBin
                  ((BamStandardIndex *)pBVar8,&refEntry.Bins,&currentBin,&currentOffset,&lastOffset)
        ;
        WriteReferenceEntry((BamStandardIndex *)pBVar1,&refEntry);
      }
      while (uVar9 = uVar9 + 1, (int)uVar9 < iVar3) {
        readerError.field_2._M_allocated_capacity._0_4_ = 0;
        readerError.field_2._8_8_ = 0;
        readerError._M_dataplus._M_p._0_4_ = uVar9;
        WriteReferenceEntry((BamStandardIndex *)pBVar1,(BaiReferenceEntry *)&readerError);
        BaiReferenceEntry::~BaiReferenceEntry((BaiReferenceEntry *)&readerError);
      }
      BaiReferenceEntry::~BaiReferenceEntry(&refEntry);
      BamAlignment::~BamAlignment((BamAlignment *)&message);
      std::__cxx11::string::~string((string *)&indexFilename);
      bVar2 = BamReaderPrivate::Rewind((BamReaderPrivate *)(pBVar1->m_filename)._M_dataplus._M_p);
      if (bVar2) {
        return true;
      }
      BamReaderPrivate::GetErrorString_abi_cxx11_
                (&readerError,(BamReaderPrivate *)(pBVar1->m_filename)._M_dataplus._M_p);
      std::operator+(&message,"could not create index: \n\t",&readerError);
      std::__cxx11::string::string
                ((string *)&refEntry,"BamStandardIndex::Create",(allocator *)&indexFilename);
      BamIndex::SetErrorString((BamIndex *)pBVar1,(string *)&refEntry,&message);
    }
    else {
      BamReaderPrivate::GetErrorString_abi_cxx11_(&readerError,(this->super_BamIndex).m_reader);
      std::operator+(&message,"could not create index: \n\t",&readerError);
      std::__cxx11::string::string
                ((string *)&refEntry,"BamStandardIndex::Create",(allocator *)&indexFilename);
      BamIndex::SetErrorString(&this->super_BamIndex,(string *)&refEntry,&message);
    }
    std::__cxx11::string::~string((string *)&refEntry);
  }
  std::__cxx11::string::~string((string *)&message);
  this_00 = &readerError;
LAB_001481f6:
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool BamStandardIndex::Create(void) {

    // skip if BamReader is invalid or not open
    if ( m_reader == 0 || !m_reader->IsOpen() ) {
        SetErrorString("BamStandardIndex::Create", "could not create index: reader is not open");
        return false;
    }

    // rewind BamReader
    if ( !m_reader->Rewind() ) {
        const string readerError = m_reader->GetErrorString();
        const string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    try {

        // open new index file (read & write)
        string indexFilename = m_reader->Filename() + Extension();
        OpenFile(indexFilename, IBamIODevice::ReadWrite);

        // initialize BaiFileSummary with number of references
        const int& numReferences = m_reader->GetReferenceCount();
        ReserveForSummary(numReferences);

        // initialize output file
        WriteHeader();

        // set up bin, ID, offset, & coordinate markers
        const uint32_t defaultValue = 0xffffffffu;
        uint32_t currentBin    = defaultValue;
        uint32_t lastBin       = defaultValue;
        int32_t  currentRefID  = defaultValue;
        int32_t  lastRefID     = defaultValue;
        uint64_t currentOffset = (uint64_t)m_reader->Tell();
        uint64_t lastOffset    = currentOffset;
        int32_t  lastPosition  = defaultValue;

        // iterate through alignments in BAM file
        BamAlignment al;
        BaiReferenceEntry refEntry;
        while ( m_reader->LoadNextAlignment(al) ) {

            // changed to new reference
            if ( lastRefID != al.RefID ) {

                // if not first reference, save previous reference data
                if ( lastRefID != (int32_t)defaultValue ) {

                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
                    WriteReferenceEntry(refEntry);
                    ClearReferenceEntry(refEntry);

                    // write any empty references between (but *NOT* including) lastRefID & al.RefID
                    for ( int i = lastRefID+1; i < al.RefID; ++i ) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }

                    // update bin markers
                    currentOffset = lastOffset;
                    currentBin    = al.Bin;
                    lastBin       = al.Bin;
                    currentRefID  = al.RefID;
                }

                // otherwise, this is first pass
                // be sure to write any empty references up to (but *NOT* including) current RefID
                else {
                    for ( int i = 0; i < al.RefID; ++i ) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }
                }

                // update reference markers
                refEntry.ID = al.RefID;
                lastRefID   = al.RefID;
                lastBin     = defaultValue;
            }

            // if lastPosition greater than current alignment position - file not sorted properly
            else if ( lastPosition > al.Position ) {
                stringstream s("");
                s << "BAM file is not properly sorted by coordinate" << endl
                  << "Current alignment position: " << al.Position
                  << " < previous alignment position: " << lastPosition
                  << " on reference ID: " << al.RefID << endl;
                SetErrorString("BamStandardIndex::Create", s.str());
                return false;
            }

            // if alignment's ref ID is valid & its bin is not a 'leaf'
            if ( (al.RefID >= 0) && (al.Bin < 4681) )
                SaveLinearOffsetEntry(refEntry.LinearOffsets, al.Position, al.GetEndPosition(), lastOffset);

            // changed to new BAI bin
            if ( al.Bin != lastBin ) {

                // if not first bin on reference, save previous bin data
                if ( currentBin != defaultValue )
                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);

                // update markers
                currentOffset = lastOffset;
                currentBin    = al.Bin;
                lastBin       = al.Bin;
                currentRefID  = al.RefID;

                // if invalid RefID, break out
                if ( currentRefID < 0 )
                    break;
            }

            // make sure that current file pointer is beyond lastOffset
            if ( m_reader->Tell() <= (int64_t)lastOffset ) {
                SetErrorString("BamStandardIndex::Create", "calculating offsets failed");
                return false;
            }

            // update lastOffset & lastPosition
            lastOffset   = m_reader->Tell();
            lastPosition = al.Position;
        }

        // after finishing alignments, if any data was read, check:
        if ( lastOffset != currentOffset ) {

            // store last alignment chunk to its bin, then write last reference entry with data
            SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
            WriteReferenceEntry(refEntry);
        }

        // then write any empty references remaining at end of file
        for ( int i = currentRefID+1; i < numReferences; ++i ) {
            BaiReferenceEntry emptyEntry(i);
            WriteReferenceEntry(emptyEntry);
        }

    } catch ( BamException& e) {
        m_errorString = e.what();
        return false;
    }

    // rewind BamReader
    if ( !m_reader->Rewind() ) {
        const string readerError = m_reader->GetErrorString();
        const string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    // return success
    return true;
}